

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_values(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  uint uVar4;
  jx9_value *pSrc;
  long *plVar5;
  uint uVar6;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 0x40) != 0)) {
    lVar1 = ((*apArg)->x).iVal;
    pSrc = jx9_context_new_array(pCtx);
    if (pSrc != (jx9_value *)0x0) {
      uVar4 = *(uint *)(lVar1 + 0x2c);
      if (uVar4 != 0) {
        plVar5 = (long *)(lVar1 + 0x10);
        uVar6 = 0;
        do {
          puVar2 = (undefined8 *)*plVar5;
          lVar3 = *(long *)*puVar2;
          if (((*(uint *)(puVar2 + 7) < *(uint *)(lVar3 + 0x210)) && (*(long *)(lVar3 + 0x208) != 0)
              ) && ((pSrc->iFlags & 0x40) != 0)) {
            HashmapInsert((jx9_hashmap *)(pSrc->x).pOther,(jx9_value *)0x0,
                          (jx9_value *)
                          (*(long *)(lVar3 + 0x208) +
                          (ulong)(*(uint *)(puVar2 + 7) * *(int *)(lVar3 + 0x218))));
            uVar4 = *(uint *)(lVar1 + 0x2c);
          }
          plVar5 = puVar2 + 9;
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar4);
      }
      jx9MemObjStore(pSrc,pCtx->pRet);
      return 0;
    }
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int jx9_hashmap_values(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap_node *pNode;
	jx9_hashmap *pMap;
	jx9_value *pArray;
	jx9_value *pObj;
	sxu32 n;
	if( nArg < 1 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation that describe the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Perform the requested operation */
	pNode = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; ++n ){
		pObj = HashmapExtractNodeValue(pNode);
		if( pObj ){
			/* perform the insertion */
			jx9_array_add_elem(pArray, 0/* Automatic index assign */, pObj);
		}
		/* Point to the next entry */
		pNode = pNode->pPrev; /* Reverse link */
	}
	/* return the new array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}